

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage_converter.cpp
# Opt level: O3

bool test_from(base_converter *cvt,uint codepoint,char *str)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_t __n;
  undefined4 in_register_00000034;
  char buf [32];
  undefined1 auStack_38 [32];
  undefined1 local_18 [8];
  
  uVar2 = (**(code **)(*(long *)cvt + 0x30))
                    (cvt,CONCAT44(in_register_00000034,codepoint),auStack_38,local_18);
  if (uVar2 == 0xffffffff || str == (char *)0x0) {
    bVar1 = uVar2 == 0xffffffff && str == (char *)0x0;
  }
  else {
    __n = strlen(str);
    if (__n == uVar2) {
      iVar3 = bcmp(str,auStack_38,__n);
      bVar1 = iVar3 == 0;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool test_from(booster::locale::util::base_converter &cvt,unsigned codepoint,char const *str)
{
    char buf[32];
    unsigned res = cvt.from_unicode(codepoint,buf,buf+sizeof(buf));
    if(res == booster::locale::util::base_converter::illegal) {
        return str == 0;
    }
    else {
        return str!=0 && strlen(str) == res && memcmp(str,buf,res) == 0;
    }
}